

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O2

void __thiscall mir::inst::Variable::Variable(Variable *this,Variable *param_2)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  bool bVar4;
  undefined1 uVar5;
  int iVar6;
  
  (this->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001daf78;
  (this->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (param_2->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (param_2->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (param_2->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  (param_2->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  bVar3 = param_2->is_temp_var;
  bVar4 = param_2->is_phi_var;
  uVar5 = param_2->field_0x1b;
  iVar6 = param_2->priority;
  this->is_memory_var = param_2->is_memory_var;
  this->is_temp_var = bVar3;
  this->is_phi_var = bVar4;
  this->field_0x1b = uVar5;
  this->priority = iVar6;
  return;
}

Assistant:

Variable() {
    is_memory_var = false;
    is_temp_var = false;
    is_phi_var = false;
  }